

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O1

GenerateBlockArraySymbol *
slang::ast::GenerateBlockArraySymbol::fromSyntax
          (Compilation *compilation,LoopGenerateSyntax *syntax,SymbolIndex scopeIndex,
          ASTContext *context,uint32_t constructIndex)

{
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> *psVar1;
  SymbolIndex SVar2;
  MemberSyntax *pMVar3;
  ExpressionSyntax *rhs;
  Type *lhs;
  ExpressionSyntax *pEVar4;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  pointer ppGVar5;
  __index_type _Var6;
  bool bVar7;
  int iVar8;
  Scope *cur;
  GenerateBlockArraySymbol *this;
  Scope *pSVar9;
  SourceLocation location;
  Expression *pEVar10;
  StatementBlockSymbol *pSVar11;
  VariableSymbol *symbol;
  undefined4 extraout_var;
  Expression *this_00;
  variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  *__v;
  variant_alternative_t<1UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar12;
  Diagnostic *pDVar13;
  Symbol *pSVar14;
  undefined4 extraout_var_01;
  char *func;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *src;
  size_type extraout_RDX_01;
  ulong uVar15;
  Scope *pSVar16;
  DiagCode code;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  *symbol_00;
  long lVar17;
  long lVar18;
  ulong uVar19;
  SVIntStorage *other;
  string_view name_00;
  Token TVar20;
  string_view sVar21;
  SourceRange SVar22;
  pair<ska::detailv3::sherwood_v3_table<slang::SVInt,_slang::SVInt,_std::hash<slang::SVInt>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<slang::SVInt>_>,_std::equal_to<slang::SVInt>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::SVInt>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>::templated_iterator<slang::SVInt>,_bool>
  pVar23;
  LookupLocation location_00;
  Token genvar;
  ConstantValue stop;
  SourceLocation loc;
  string_view name;
  anon_class_40_5_68e605a5 createBlock;
  SmallVector<const_slang::ast::GenerateBlockSymbol_*,_5UL> entries;
  ConstantValue initialVal;
  SmallVector<slang::SVInt,_8UL> indices;
  SmallSet<slang::SVInt,_8UL,_ska::detailv3::sherwood_v3_entry<slang::SVInt>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>
  usedValues;
  EvalContext evalContext;
  Token local_5e8;
  Expression *local_5d0;
  uint32_t local_5c4;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_5c0;
  char local_5a0;
  ulong local_598;
  SourceLocation local_590;
  SourceRange local_588;
  string_view local_578;
  ASTContext local_568;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_530;
  undefined1 local_510;
  anon_class_40_5_68e605a5 local_508;
  SmallVector<const_slang::ast::GenerateBlockSymbol_*,_5UL> local_4e0;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_4a0;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_478;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_450;
  SmallVectorBase<slang::SVInt> local_428 [3];
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_390;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_368;
  StackAllocStorage<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL> local_340;
  sherwood_v3_table<slang::SVInt,_slang::SVInt,_std::hash<slang::SVInt>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<slang::SVInt>_>,_std::equal_to<slang::SVInt>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::SVInt>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>
  local_278;
  EvalContext local_250;
  undefined4 extraout_var_00;
  
  pMVar3 = (syntax->block).ptr;
  local_5c4 = constructIndex;
  if (pMVar3 != (MemberSyntax *)0x0) {
    local_578 = getGenerateBlockName(&pMVar3->super_SyntaxNode);
    pMVar3 = (syntax->block).ptr;
    if (pMVar3 != (MemberSyntax *)0x0) {
      TVar20 = slang::syntax::SyntaxNode::getFirstToken(&pMVar3->super_SyntaxNode);
      local_250.compilation._0_4_ = TVar20._0_4_;
      local_250.compilation._4_4_ = TVar20.rawLen;
      local_250._8_4_ = TVar20.info._0_4_;
      local_250.steps = TVar20.info._4_4_;
      local_590 = parsing::Token::location((Token *)&local_250);
      this = BumpAllocator::
             emplace<slang::ast::GenerateBlockArraySymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,unsigned_int&>
                       (&compilation->super_BumpAllocator,compilation,&local_578,&local_590,
                        &local_5c4);
      (this->super_Symbol).originatingSyntax = (SyntaxNode *)syntax;
      pSVar16 = (context->scope).ptr;
      if (pSVar16 != (Scope *)0x0) {
        psVar1 = &(syntax->super_MemberSyntax).attributes.
                  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>;
        syntax_00.data_ = psVar1->data_;
        syntax_00.size_ = psVar1->size_;
        if ((syntax->super_MemberSyntax).attributes.
            super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ != 0
            && psVar1->data_ == (pointer)0x0) {
          std::terminate();
        }
        Symbol::setAttributes(&this->super_Symbol,pSVar16,syntax_00);
        local_5e8.kind = (syntax->identifier).kind;
        local_5e8._2_1_ = (syntax->identifier).field_0x2;
        local_5e8.numFlags.raw = (syntax->identifier).numFlags;
        local_5e8.rawLen = (syntax->identifier).rawLen;
        local_5e8.info = (syntax->identifier).info;
        if ((local_5e8._0_8_ & 0x10000) != 0) {
          return this;
        }
        pSVar16 = (context->scope).ptr;
        if (pSVar16 != (Scope *)0x0) {
          lVar18 = 0;
          pSVar9 = pSVar16;
          do {
            pSVar14 = pSVar9->thisSym;
            if (pSVar14->kind == GenerateBlock) {
LAB_001b8e66:
              pSVar9 = pSVar14->parentScope;
              bVar7 = false;
            }
            else {
              bVar7 = true;
              if (pSVar14->kind == GenerateBlockArray) {
                lVar18 = (lVar18 + (ulong)(lVar18 == 0)) * (long)pSVar14[1].originatingSyntax;
                goto LAB_001b8e66;
              }
            }
          } while ((pSVar9 != (Scope *)0x0) && (!bVar7));
          uVar19 = lVar18 + (ulong)(lVar18 == 0);
          local_598 = (ulong)(compilation->options).maxGenerateSteps;
          if ((syntax->genvar).info != (Info *)0x0) {
LAB_001b8e9e:
            local_4e0.super_SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*>.data_ =
                 (pointer)local_4e0.super_SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*>.
                          firstElement;
            local_4e0.super_SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*>.len = 0;
            local_4e0.super_SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*>.cap = 5;
            local_508.genvar = &local_5e8;
            local_508.entries = &local_4e0;
            rhs = (syntax->initialExpr).ptr;
            local_508.compilation = compilation;
            local_508.loc = &local_590;
            local_508.syntax = syntax;
            if (rhs == (ExpressionSyntax *)0x0) {
              assert::assertFailed
                        ("ptr",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                         ,0x26,
                         "T slang::not_null<slang::syntax::ExpressionSyntax *>::get() const [T = slang::syntax::ExpressionSyntax *]"
                        );
            }
            lhs = compilation->integerType;
            location = parsing::Token::location(&syntax->equals);
            pEVar10 = Expression::bindRValue
                                (lhs,rhs,location,context,(bitmask<slang::ast::ASTFlags>)0x0);
            ASTContext::eval((ConstantValue *)&local_4a0,context,pEVar10,
                             (bitmask<slang::ast::EvalFlags>)0x0);
            if (local_4a0._M_index != '\0') {
              local_250.compilation._0_4_ = 0;
              local_340.buffer._0_8_ = local_340.buffer._0_8_ & 0xffffffff00000000;
              pSVar11 = BumpAllocator::
                        emplace<slang::ast::StatementBlockSymbol,slang::ast::Compilation&,char_const(&)[1],slang::SourceLocation&,slang::ast::StatementBlockKind,slang::ast::VariableLifetime>
                                  (&compilation->super_BumpAllocator,compilation,
                                   (char (*) [1])0x3d6541,&local_590,
                                   (StatementBlockKind *)&local_250,(VariableLifetime *)&local_340);
              sVar21 = parsing::Token::valueText(&local_5e8);
              local_250.compilation._0_4_ = (undefined4)sVar21._M_len;
              local_250.compilation._4_4_ = sVar21._M_len._4_4_;
              local_250._8_4_ = sVar21._M_str._0_4_;
              local_250.steps = sVar21._M_str._4_4_;
              local_340.buffer._0_8_ = parsing::Token::location(&local_5e8);
              local_428[0].data_ = (pointer)((ulong)local_428[0].data_._4_4_ << 0x20);
              symbol = BumpAllocator::
                       emplace<slang::ast::VariableSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::VariableLifetime>
                                 (&compilation->super_BumpAllocator,
                                  (basic_string_view<char,_std::char_traits<char>_> *)&local_250,
                                  (SourceLocation *)&local_340,(VariableLifetime *)local_428);
              (symbol->super_ValueSymbol).declaredType.type = compilation->integerType;
              *(byte *)&(symbol->flags).m_bits = (byte)(symbol->flags).m_bits | 2;
              pSVar16 = (context->scope).ptr;
              if (pSVar16 == (Scope *)0x0) {
                assert::assertFailed
                          ("ptr",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                           ,0x26,
                           "T slang::not_null<const slang::ast::Scope *>::get() const [T = const slang::ast::Scope *]"
                          );
              }
              (pSVar11->super_Symbol).parentScope = pSVar16;
              (pSVar11->super_Symbol).indexInScope = scopeIndex;
              pSVar16 = &pSVar11->super_Scope;
              Scope::addMember(pSVar16,(Symbol *)symbol);
              local_568.lookupIndex = 0xffffffff;
              local_568.flags.m_bits = 0;
              local_568.instanceOrProc = (Symbol *)0x0;
              local_568.firstTempVar = (TempVarSymbol *)0x0;
              local_568.randomizeDetails = (RandomizeDetails *)0x0;
              local_568.assertionInstance = (AssertionInstanceDetails *)0x0;
              pEVar4 = (syntax->stopExpr).ptr;
              local_568.scope.ptr = pSVar16;
              if (pEVar4 == (ExpressionSyntax *)0x0) {
                assert::assertFailed
                          ("ptr",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                           ,0x26,
                           "T slang::not_null<slang::syntax::ExpressionSyntax *>::get() const [T = slang::syntax::ExpressionSyntax *]"
                          );
              }
              iVar8 = Expression::bind((int)pEVar4,(sockaddr *)&local_568,0);
              pEVar10 = (Expression *)CONCAT44(extraout_var,iVar8);
              pEVar4 = (syntax->iterationExpr).ptr;
              if (pEVar4 == (ExpressionSyntax *)0x0) {
                assert::assertFailed
                          ("ptr",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                           ,0x26,
                           "T slang::not_null<slang::syntax::ExpressionSyntax *>::get() const [T = slang::syntax::ExpressionSyntax *]"
                          );
              }
              iVar8 = Expression::bind((int)pEVar4,(sockaddr *)&local_568,0x20);
              this_00 = (Expression *)CONCAT44(extraout_var_00,iVar8);
              bVar7 = Expression::bad(pEVar10);
              if (!bVar7) {
                bVar7 = Expression::bad(this_00);
                if (!bVar7) {
                  bVar7 = ASTContext::requireBooleanConvertible(context,pEVar10);
                  if (bVar7) {
                    local_250.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.data_ =
                         (pointer)local_250.stack.
                                  super_SmallVectorBase<slang::ast::EvalContext::Frame>.firstElement
                    ;
                    local_250._8_4_ = local_250._8_4_ & 0xffffff00;
                    local_250.steps = 0;
                    local_250.disableTarget._0_4_ = 0;
                    local_250._20_8_ = 0;
                    local_250.queueTarget._4_4_ = 0;
                    local_250.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.len = 0;
                    local_250.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.cap = 2;
                    local_250.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.data_ =
                         (pointer)local_250.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.
                                  firstElement;
                    local_250.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.len = 0;
                    local_250.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.cap = 5;
                    local_250.diags.super_SmallVector<slang::Diagnostic,_2UL>.
                    super_SmallVectorBase<slang::Diagnostic>.data_ =
                         (pointer)local_250.diags.super_SmallVector<slang::Diagnostic,_2UL>.
                                  super_SmallVectorBase<slang::Diagnostic>.firstElement;
                    local_250.diags.super_SmallVector<slang::Diagnostic,_2UL>.
                    super_SmallVectorBase<slang::Diagnostic>.len = 0;
                    local_250.diags.super_SmallVector<slang::Diagnostic,_2UL>.
                    super_SmallVectorBase<slang::Diagnostic>.cap = 2;
                    local_250.disableRange.startLoc = (SourceLocation)0x0;
                    local_250.disableRange.endLoc = (SourceLocation)0x0;
                    local_250.compilation = compilation;
                    EvalContext::pushEmptyFrame(&local_250);
                    std::__detail::__variant::
                    _Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                    ::_Copy_ctor_base((_Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                       *)&local_478,
                                      (_Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                       *)&local_4a0);
                    __v = &EvalContext::createLocal
                                     (&local_250,&symbol->super_ValueSymbol,
                                      (ConstantValue *)&local_478)->value;
                    std::__detail::__variant::
                    _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                    ::~_Variant_storage(&local_478);
                    pvVar12 = std::
                              get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                                        (__v);
                    if ((pvVar12->super_SVIntStorage).unknownFlag == true) {
                      SVar22 = parsing::Token::range(&local_5e8);
                      pDVar13 = ASTContext::addDiag(&local_568,(DiagCode)0x280006,SVar22);
                      Diagnostic::operator<<(pDVar13,(ConstantValue *)__v);
                    }
                    local_340.ptr = (sherwood_v3_entry<slang::SVInt> *)&local_340;
                    local_5d0 = pEVar10;
                    local_278.
                    super_StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>.
                    storage = (StackAllocStorage<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>
                               *)local_340.ptr;
                    local_278.entries = ska::detailv3::empty_default_table<slang::SVInt>();
                    local_278.num_slots_minus_one = 0;
                    local_278.hash_policy.shift = '?';
                    local_278.max_lookups = '\x03';
                    local_278._max_load_factor = 0.5;
                    local_278.num_elements = 0;
                    local_428[0].data_ = (pointer)local_428[0].firstElement;
                    local_428[0].len = 0;
                    local_428[0].cap = 8;
                    if (uVar19 <= local_598) {
                      uVar15 = uVar19;
                      do {
                        Expression::eval((ConstantValue *)&local_5c0,local_5d0,&local_250);
                        if (local_5a0 == '\0') {
LAB_001b9433:
                          this->valid = local_5a0 != '\0';
LAB_001b9488:
                          std::__detail::__variant::
                          _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                          ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                               *)&local_5c0);
                          if (local_428[0].len == 0) {
                            Expression::eval((ConstantValue *)&local_390,this_00,&local_250);
                            std::__detail::__variant::
                            _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                            ::~_Variant_storage(&local_390);
                          }
                          EvalContext::reportDiags(&local_250,&local_568);
                          src = extraout_RDX;
                          if ((this->valid == true) && (local_428[0].len != 0)) {
                            lVar18 = local_428[0].len << 4;
                            other = &(local_428[0].data_)->super_SVIntStorage;
                            do {
                              SVInt::SVInt((SVInt *)&local_450,other);
                              local_450._M_index = '\x01';
                              fromSyntax::anon_class_40_5_68e605a5::operator()
                                        (&local_508,(ConstantValue *)&local_450,true);
                              std::__detail::__variant::
                              _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                              ::~_Variant_storage(&local_450);
                              other = other + 1;
                              lVar18 = lVar18 + -0x10;
                              src = extraout_RDX_00;
                            } while (lVar18 != 0);
                          }
                          iVar8 = SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*>::copy
                                            (&local_4e0.
                                              super_SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*>
                                             ,(EVP_PKEY_CTX *)compilation,src);
                          ppGVar5 = local_4e0.
                                    super_SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*>.
                                    data_;
                          (this->entries).data_ = (pointer)CONCAT44(extraout_var_01,iVar8);
                          (this->entries).size_ = extraout_RDX_01;
                          if (local_4e0.
                              super_SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*>.len ==
                              0) {
                            local_5c0._0_8_ = (void *)0x0;
                            local_5c0._8_4_ = 0x20;
                            local_5c0._12_2_ = 1;
                            SVInt::clearUnusedBits((SVInt *)&local_5c0);
                            local_530._0_8_ = local_5c0._0_8_;
                            local_530._8_4_ = local_5c0._8_4_;
                            local_530._12_1_ = local_5c0._12_1_;
                            local_530._13_1_ = local_5c0._13_1_;
                            if (0x40 < (uint)local_5c0._8_4_ || (local_5c0._12_2_ & 0x100) != 0) {
                              local_5c0._0_8_ = (void *)0x0;
                            }
                            symbol_00 = &local_530;
                            local_510 = 1;
                            fromSyntax::anon_class_40_5_68e605a5::operator()
                                      (&local_508,(ConstantValue *)symbol_00,false);
                            std::__detail::__variant::
                            _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                            ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                                 *)&local_530);
                            if (((0x40 < (uint)local_5c0._8_4_) || ((local_5c0._12_2_ & 0x100) != 0)
                                ) && ((void *)local_5c0._0_8_ != (void *)0x0)) {
                              operator_delete__((void *)local_5c0._0_8_);
                            }
                          }
                          else {
                            lVar18 = local_4e0.
                                     super_SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*>.
                                     len << 3;
                            lVar17 = 0;
                            do {
                              symbol_00 = *(_Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                            **)((long)ppGVar5 + lVar17);
                              Scope::addMember(&this->super_Scope,(Symbol *)symbol_00);
                              lVar17 = lVar17 + 8;
                            } while (lVar18 != lVar17);
                          }
                          goto LAB_001b964e;
                        }
                        bVar7 = ConstantValue::isTrue((ConstantValue *)&local_5c0);
                        if (!bVar7) goto LAB_001b9433;
                        pvVar12 = std::
                                  get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                                            (__v);
                        SmallVectorBase<slang::SVInt>::emplace_back<slang::SVInt&>
                                  (local_428,pvVar12);
                        pvVar12 = std::
                                  get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                                            (__v);
                        pVar23 = ska::detailv3::
                                 sherwood_v3_table<slang::SVInt,slang::SVInt,std::hash<slang::SVInt>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::SVInt>>,std::equal_to<slang::SVInt>,ska::detailv3::functor_storage<bool,std::equal_to<slang::SVInt>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,8ul>>
                                 ::emplace<slang::SVInt&>
                                           ((sherwood_v3_table<slang::SVInt,slang::SVInt,std::hash<slang::SVInt>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::SVInt>>,std::equal_to<slang::SVInt>,ska::detailv3::functor_storage<bool,std::equal_to<slang::SVInt>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,8ul>>
                                             *)&local_278,pvVar12);
                        if (((undefined1  [16])pVar23 & (undefined1  [16])0x1) ==
                            (undefined1  [16])0x0) {
                          SVar22 = parsing::Token::range(&local_5e8);
                          code.subsystem = Declarations;
                          code.code = 0x27;
LAB_001b946b:
                          pDVar13 = ASTContext::addDiag(&local_568,code,SVar22);
                          Diagnostic::operator<<(pDVar13,(ConstantValue *)__v);
                          goto LAB_001b9488;
                        }
                        Expression::eval((ConstantValue *)&local_368,this_00,&local_250);
                        _Var6 = local_368._M_index;
                        std::__detail::__variant::
                        _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                        ::~_Variant_storage(&local_368);
                        if (_Var6 == '\0') goto LAB_001b9488;
                        pvVar12 = std::
                                  get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                                            (__v);
                        if ((pvVar12->super_SVIntStorage).unknownFlag == true) {
                          SVar22 = parsing::Token::range(&local_5e8);
                          code.subsystem = Declarations;
                          code.code = 0x28;
                          goto LAB_001b946b;
                        }
                        std::__detail::__variant::
                        _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                        ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                             *)&local_5c0);
                        uVar15 = uVar15 + uVar19;
                      } while (uVar15 <= local_598);
                    }
                    SVar22 = parsing::Token::range(&syntax->keyword);
                    symbol_00 = (_Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                 *)0x500006;
                    ASTContext::addDiag(context,(DiagCode)0x500006,SVar22);
LAB_001b964e:
                    SmallVectorBase<slang::SVInt>::cleanup(local_428,(EVP_PKEY_CTX *)symbol_00);
                    ska::detailv3::
                    sherwood_v3_table<slang::SVInt,_slang::SVInt,_std::hash<slang::SVInt>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<slang::SVInt>_>,_std::equal_to<slang::SVInt>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::SVInt>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>
                    ::~sherwood_v3_table(&local_278);
                    SmallVectorBase<slang::Diagnostic>::cleanup
                              ((SmallVectorBase<slang::Diagnostic> *)&local_250.diags,
                               (EVP_PKEY_CTX *)symbol_00);
                    if (local_250.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.data_ !=
                        (pointer)local_250.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.
                                 firstElement) {
                      free(local_250.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.data_);
                    }
                    SmallVectorBase<slang::ast::EvalContext::Frame>::cleanup
                              (&local_250.stack.
                                super_SmallVectorBase<slang::ast::EvalContext::Frame>,
                               (EVP_PKEY_CTX *)symbol_00);
                  }
                }
              }
            }
            std::__detail::__variant::
            _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            ::~_Variant_storage(&local_4a0);
            if (local_4e0.super_SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*>.data_ !=
                (pointer)local_4e0.super_SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*>.
                         firstElement) {
              free(local_4e0.super_SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*>.data_);
            }
            return this;
          }
          sVar21 = parsing::Token::valueText(&local_5e8);
          local_5d0 = (Expression *)sVar21._M_str;
          pSVar9 = (context->scope).ptr;
          if (pSVar9 != (Scope *)0x0) {
            SVar2 = context->lookupIndex;
            local_588 = parsing::Token::range(&local_5e8);
            name_00._M_str = (char *)local_5d0;
            name_00._M_len = sVar21._M_len;
            location_00.index = SVar2;
            location_00.scope = pSVar9;
            location_00._12_4_ = 0;
            pSVar14 = Lookup::unqualifiedAt
                                (pSVar16,name_00,location_00,local_588,
                                 (bitmask<slang::ast::LookupFlags>)0x0);
            if (pSVar14 == (Symbol *)0x0) {
              return this;
            }
            if (pSVar14->kind != Genvar) {
              SVar22 = parsing::Token::range(&local_5e8);
              pDVar13 = ASTContext::addDiag(context,(DiagCode)0x1a000a,SVar22);
              sVar21 = parsing::Token::valueText(&local_5e8);
              Diagnostic::operator<<(pDVar13,sVar21);
              Diagnostic::addNote(pDVar13,(DiagCode)0x40001,pSVar14->location);
              return this;
            }
            goto LAB_001b8e9e;
          }
        }
      }
      func = 
      "T slang::not_null<const slang::ast::Scope *>::get() const [T = const slang::ast::Scope *]";
      goto LAB_001b970e;
    }
  }
  func = 
  "T slang::not_null<slang::syntax::MemberSyntax *>::get() const [T = slang::syntax::MemberSyntax *]"
  ;
LAB_001b970e:
  assert::assertFailed
            ("ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
             ,0x26,func);
}

Assistant:

GenerateBlockArraySymbol& GenerateBlockArraySymbol::fromSyntax(Compilation& compilation,
                                                               const LoopGenerateSyntax& syntax,
                                                               SymbolIndex scopeIndex,
                                                               const ASTContext& context,
                                                               uint32_t constructIndex) {
    string_view name = getGenerateBlockName(*syntax.block);
    SourceLocation loc = syntax.block->getFirstToken().location();
    auto result = compilation.emplace<GenerateBlockArraySymbol>(compilation, name, loc,
                                                                constructIndex);
    result->setSyntax(syntax);
    result->setAttributes(*context.scope, syntax.attributes);

    auto genvar = syntax.identifier;
    if (genvar.isMissing())
        return *result;

    // Walk up the tree a bit to see if we're nested inside another generate loop.
    // If we are, we'll include that parent's array size in our decision about
    // wether we've looped too many times within one generate block.
    const uint64_t baseCount = getGenerateLoopCount(*context.scope);
    const uint64_t loopLimit = compilation.getOptions().maxGenerateSteps;

    // If the loop initializer has a `genvar` keyword, we can use the name directly
    // Otherwise we need to do a lookup to make sure we have the actual genvar somewhere.
    if (!syntax.genvar) {
        auto symbol = Lookup::unqualifiedAt(*context.scope, genvar.valueText(),
                                            context.getLocation(), genvar.range());
        if (!symbol)
            return *result;

        if (symbol->kind != SymbolKind::Genvar) {
            auto& diag = context.addDiag(diag::NotAGenvar, genvar.range());
            diag << genvar.valueText();
            diag.addNote(diag::NoteDeclarationHere, symbol->location);
            return *result;
        }
    }

    SmallVector<const GenerateBlockSymbol*> entries;
    auto createBlock = [&](ConstantValue value, bool isInstantiated) {
        // Spec: each generate block gets their own scope, with an implicit
        // localparam of the same name as the genvar.
        auto block = compilation.emplace<GenerateBlockSymbol>(compilation, "", loc, 1u,
                                                              isInstantiated);
        auto implicitParam = compilation.emplace<ParameterSymbol>(
            genvar.valueText(), genvar.location(), true /* isLocal */, false /* isPort */);

        block->addMember(*implicitParam);
        block->setSyntax(*syntax.block);

        if (isInstantiated)
            addBlockMembers(*block, *syntax.block);

        implicitParam->setType(compilation.getIntegerType());
        implicitParam->setValue(compilation, std::move(value), /* needsCoercion */ false);

        block->arrayIndex = &implicitParam->getValue().integer();
        entries.push_back(block);
    };

    // Bind the initialization expression.
    auto& initial = Expression::bindRValue(compilation.getIntegerType(), *syntax.initialExpr,
                                           syntax.equals.location(), context);
    ConstantValue initialVal = context.eval(initial);
    if (!initialVal)
        return *result;

    // Fabricate a local variable that will serve as the loop iteration variable.
    auto& iterScope = *compilation.emplace<StatementBlockSymbol>(compilation, "", loc,
                                                                 StatementBlockKind::Sequential,
                                                                 VariableLifetime::Automatic);
    auto& local = *compilation.emplace<VariableSymbol>(genvar.valueText(), genvar.location(),
                                                       VariableLifetime::Automatic);
    local.setType(compilation.getIntegerType());
    local.flags |= VariableFlags::CompilerGenerated;

    iterScope.setTemporaryParent(*context.scope, scopeIndex);
    iterScope.addMember(local);

    // Bind the stop and iteration expressions so we can reuse them on each iteration.
    ASTContext iterContext(iterScope, LookupLocation::max);
    auto& stopExpr = Expression::bind(*syntax.stopExpr, iterContext);
    auto& iterExpr = Expression::bind(*syntax.iterationExpr, iterContext,
                                      ASTFlags::AssignmentAllowed);
    if (stopExpr.bad() || iterExpr.bad())
        return *result;

    if (!context.requireBooleanConvertible(stopExpr))
        return *result;

    // Create storage for the iteration variable.
    EvalContext evalContext(compilation);
    evalContext.pushEmptyFrame();

    auto loopVal = evalContext.createLocal(&local, initialVal);
    if (loopVal->integer().hasUnknown())
        iterContext.addDiag(diag::GenvarUnknownBits, genvar.range()) << *loopVal;

    // Generate blocks! In the first pass we evaluate all indices for correctness,
    // letting us enforce the loop limit to detect infinite loops before trying
    // to generate more hierarchy.
    uint64_t loopCount = 0;
    SmallSet<SVInt, 8> usedValues;
    SmallVector<SVInt, 8> indices;
    while (true) {
        loopCount += baseCount;
        if (loopCount > loopLimit) {
            context.addDiag(diag::MaxGenerateStepsExceeded, syntax.keyword.range());
            return *result;
        }

        auto stop = stopExpr.eval(evalContext);
        if (stop.bad() || !stop.isTrue()) {
            result->valid = !stop.bad();
            break;
        }

        indices.emplace_back(loopVal->integer());
        auto pair = usedValues.emplace(loopVal->integer());
        if (!pair.second) {
            iterContext.addDiag(diag::GenvarDuplicate, genvar.range()) << *loopVal;
            break;
        }

        if (!iterExpr.eval(evalContext))
            break;

        if (loopVal->integer().hasUnknown()) {
            iterContext.addDiag(diag::GenvarUnknownBits, genvar.range()) << *loopVal;
            break;
        }
    }

    // If we never ran the iteration expression, run it once to ensure
    // we've collected all errors.
    if (indices.empty())
        iterExpr.eval(evalContext);

    evalContext.reportDiags(iterContext);

    // If the generate loop completed successfully, go through and create blocks.
    if (result->valid) {
        for (auto& index : indices)
            createBlock(index, true);
    }

    result->entries = entries.copy(compilation);
    if (entries.empty())
        createBlock(SVInt(32, 0, true), false);
    else {
        for (auto entry : entries)
            result->addMember(*entry);
    }

    return *result;
}